

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,decimal_fp<float> *fp,
          basic_format_specs<wchar_t> *specs,float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  byte bVar2;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar3;
  byte *pbVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  byte *pbVar8;
  uint uVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  long lVar12;
  size_t sVar13;
  bool bVar14;
  bool pointy;
  int significand_size;
  wchar_t decimal_point;
  sign_t sign;
  significand_type significand;
  wchar_t zero;
  int exp;
  int num_zeros;
  anon_class_32_8_b693abdd write;
  wchar_t local_d0;
  wchar_t local_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  wchar_t local_b0;
  undefined1 local_ac [12];
  long local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  int local_88;
  basic_format_specs<wchar_t> *local_80;
  anon_class_72_9_d68ba176 local_78;
  
  local_b8._4_4_ = fp->significand;
  uVar9 = 0x1f;
  if ((local_b8._4_4_ | 1) != 0) {
    for (; (local_b8._4_4_ | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar6 = (ulong)(uint)local_b8._4_4_ +
          *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar9 * 8);
  local_cc = (wchar_t)(uVar6 >> 0x20);
  local_b0 = 0x30;
  local_c8._4_4_ = fspecs._4_4_;
  local_b8._0_4_ = (uint)local_c8._4_4_ >> 8 & 0xff;
  fVar1 = fspecs;
  if ((long)uVar6 < 0) goto LAB_001768b5;
  bVar14 = local_b8._0_4_ != none;
  local_c8._12_4_ = L'.';
  uVar9 = (uint)local_c8._4_4_ >> 0x11;
  local_c8._0_8_ = fspecs;
  if ((uVar9 & 1) != 0) {
    local_c8._12_4_ = fmt::v8::detail::decimal_point_impl<wchar_t>(loc);
  }
  lVar12 = (ulong)bVar14 + (uVar6 >> 0x20);
  uVar9 = fp->exponent;
  local_ac._0_4_ = local_cc + uVar9;
  wVar10 = (wchar_t)local_c8._0_8_;
  if (SUB81(local_c8._0_8_,4) == '\x01') {
LAB_00176540:
    iVar5 = uVar9 + local_cc + -1;
    if (((uint)local_c8._4_4_ >> 0x14 & 1) == 0) {
      uVar6 = 0;
      if (local_cc == L'\x01') {
        local_c8._12_4_ = L'\0';
      }
    }
    else {
      uVar6 = 0;
      if (0 < wVar10 - local_cc) {
        uVar6 = (ulong)(uint)(wVar10 - local_cc);
      }
      lVar12 = lVar12 + uVar6;
    }
    local_78.sign = (sign_t *)CONCAT44(local_b8._4_4_,local_b8._0_4_);
    local_78.significand = (significand_type *)CONCAT44(local_c8._12_4_,local_cc);
    local_78.significand_size = (int *)CONCAT44(0x30,(int)uVar6);
    local_78.fp = (decimal_fp<float> *)
                  (CONCAT44(iVar5,(int)CONCAT71(local_78.fp._1_7_,
                                                (((uint)local_c8._4_4_ >> 0x10 & 1) == 0) << 5)) |
                  0x45);
    if (specs->width < 1) {
      bVar3 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<float>,_wchar_t,_fmt::v8::detail::digit_grouping<wchar_t>_>
              ::anon_class_32_8_b693abdd::operator()
                        ((anon_class_32_8_b693abdd *)&local_78,out.container);
    }
    else {
      if ((int)local_ac._0_4_ < L'\x01') {
        iVar5 = 1 - local_ac._0_4_;
      }
      lVar7 = 2;
      if (99 < iVar5) {
        lVar7 = (ulong)(999 < iVar5) + 3;
      }
      sVar13 = lVar12 + lVar7 + (3 - (ulong)(local_c8._12_4_ == L'\0'));
      bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                        (out,specs,sVar13,sVar13,(anon_class_32_8_b693abdd *)&local_78);
    }
  }
  else {
    if ((local_c8._0_8_ & 0xff00000000) == 0) {
      wVar11 = L'\x10';
      if (L'\0' < wVar10) {
        wVar11 = wVar10;
      }
      if (((int)local_ac._0_4_ < L'\xfffffffd') || (wVar11 < (int)local_ac._0_4_))
      goto LAB_00176540;
    }
    if ((int)uVar9 < 0) {
      if ((int)local_ac._0_4_ < L'\x01') {
        wVar11 = -local_ac._0_4_;
        local_ac._4_4_ = wVar11;
        if (SBORROW4(wVar10,wVar11) != wVar10 + local_ac._0_4_ < 0) {
          local_ac._4_4_ = wVar10;
        }
        if (wVar10 < L'\0') {
          local_ac._4_4_ = wVar11;
        }
        if (local_cc != L'\0') {
          local_ac._4_4_ = wVar11;
        }
        bVar2 = 1;
        if (local_cc == L'\0' && local_ac._4_4_ == L'\0') {
          bVar2 = (local_c8[6] & 0x10) >> 4;
        }
        local_d0 = CONCAT31(local_d0._1_3_,bVar2);
        fVar1 = (float_specs)local_c8._0_8_;
        if (L'\xffffffff' < (int)local_ac._4_4_) {
          sVar13 = lVar12 + (ulong)((uint)bVar2 + local_ac._4_4_ + 1);
          local_78.sign = (sign_t *)local_b8;
          local_78.significand = (significand_type *)&local_b0;
          local_78.significand_size = &local_d0;
          local_78.fp = (decimal_fp<float> *)(local_c8 + 0xc);
          local_78.grouping = (digit_grouping<wchar_t> *)(local_ac + 4);
          local_78.fspecs = (float_specs *)(local_b8 + 4);
          local_78.decimal_point = &local_cc;
          bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_&>
                            (out,specs,sVar13,sVar13,(anon_class_56_7_162c6e41 *)&local_78);
          return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar3.container;
        }
LAB_001768b5:
        local_c8._0_8_ = fVar1;
        fmt::v8::detail::assert_fail
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                   ,0x195,"negative value");
      }
      wVar11 = L'\0';
      local_d0 = wVar10 - local_cc & (int)(local_c8._4_4_ << 0xb) >> 0x1f;
      wVar10 = local_d0;
      if (local_d0 < L'\x01') {
        wVar10 = L'\0';
      }
      local_80 = specs;
      digit_grouping<wchar_t>::digit_grouping
                ((digit_grouping<wchar_t> *)(local_ac + 4),loc,
                 (bool)((byte)((uint)local_c8._4_4_ >> 0x11) & 1));
      pbVar4 = (byte *)CONCAT44(local_ac._8_4_,local_ac._4_4_);
      pbVar8 = pbVar4 + local_a0;
      sVar13 = (ulong)(uint)wVar10 + (uVar6 >> 0x20) + (ulong)bVar14;
      do {
        wVar10 = L'\x7fffffff';
        if (local_88 != 0) {
          if (pbVar4 == pbVar8) {
            uVar9 = (uint)(char)pbVar8[-1];
          }
          else {
            bVar2 = *pbVar4;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_00176787;
            pbVar4 = pbVar4 + 1;
            uVar9 = (uint)bVar2;
          }
          wVar11 = wVar11 + uVar9;
          wVar10 = wVar11;
        }
LAB_00176787:
        sVar13 = sVar13 + 1;
      } while (wVar10 < local_cc);
      local_78.sign = (sign_t *)local_b8;
      local_78.significand = (significand_type *)(local_b8 + 4);
      local_78.significand_size = &local_cc;
      local_78.fp = (decimal_fp<float> *)local_ac;
      local_78.grouping = (digit_grouping<wchar_t> *)(local_c8 + 0xc);
      local_78.decimal_point = &local_d0;
      local_78.num_zeros = &local_b0;
      local_78.fspecs = (float_specs *)(local_ac + 4);
      bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_&>
                        (out,local_80,sVar13,sVar13,(anon_class_64_8_e6ffa566 *)&local_78);
    }
    else {
      lVar12 = lVar12 + (ulong)uVar9;
      local_d0 = wVar10 - local_ac._0_4_;
      if (((uint)local_c8._4_4_ >> 0x14 & 1) != 0) {
        if (SUB81(local_c8._0_8_,4) != '\x02' && local_d0 < L'\x01') {
          local_d0 = L'\x01';
        }
        if (L'\0' < local_d0) {
          lVar12 = lVar12 + (ulong)(uint)local_d0 + 1;
        }
      }
      digit_grouping<wchar_t>::digit_grouping
                ((digit_grouping<wchar_t> *)(local_ac + 4),loc,
                 (bool)((byte)((uint)local_c8._4_4_ >> 0x11) & 1));
      pbVar4 = (byte *)CONCAT44(local_ac._8_4_,local_ac._4_4_);
      pbVar8 = pbVar4 + local_a0;
      sVar13 = lVar12 - 1;
      wVar10 = L'\0';
      do {
        wVar11 = L'\x7fffffff';
        if (local_88 != 0) {
          if (pbVar4 == pbVar8) {
            uVar9 = (uint)(char)pbVar8[-1];
          }
          else {
            bVar2 = *pbVar4;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_0017667c;
            pbVar4 = pbVar4 + 1;
            uVar9 = (uint)bVar2;
          }
          wVar10 = wVar10 + uVar9;
          wVar11 = wVar10;
        }
LAB_0017667c:
        sVar13 = sVar13 + 1;
      } while (wVar11 < local_cc);
      local_78.sign = (sign_t *)local_b8;
      local_78.significand = (significand_type *)(local_b8 + 4);
      local_78.significand_size = &local_cc;
      local_78.fspecs = (float_specs *)local_c8;
      local_78.decimal_point = (wchar_t *)(local_c8 + 0xc);
      local_78.num_zeros = &local_d0;
      local_78.zero = &local_b0;
      local_78.fp = fp;
      local_78.grouping = (digit_grouping<wchar_t> *)(local_ac + 4);
      bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_&>
                        (out,specs,sVar13,sVar13,&local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_ac._8_4_,local_ac._4_4_) != &local_98) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_ac._8_4_,local_ac._4_4_),local_98._M_allocated_capacity + 1)
      ;
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}